

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::Read(cmELFInternalImpl<cmELFTypes64> *this,ELF_Shdr *x)

{
  bool bVar1;
  byte bVar2;
  long *plVar3;
  ELF_Shdr *x_local;
  cmELFInternalImpl<cmELFTypes64> *this_local;
  
  plVar3 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream,(long)x);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar1) && (((this->super_cmELFInternal).NeedSwap & 1U) != 0)) {
    ByteSwap(this,x);
  }
  bVar2 = std::ios::fail();
  return (bool)((bVar2 ^ 0xff) & 1);
}

Assistant:

bool Read(ELF_Shdr& x)
  {
    if (this->Stream.read(reinterpret_cast<char*>(&x), sizeof(x)) &&
        this->NeedSwap) {
      ByteSwap(x);
    }
    return !this->Stream.fail();
  }